

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_cursor.cxx
# Opt level: O0

void __thiscall Fl_Window::cursor(Fl_Window *this,Fl_RGB_Image *image,int hotx,int hoty)

{
  int iVar1;
  Fl_Window *local_38;
  Fl_Window *toplevel;
  Fl_Window *w;
  int ret;
  int hoty_local;
  int hotx_local;
  Fl_RGB_Image *image_local;
  Fl_Window *this_local;
  
  toplevel = Fl_Widget::window((Fl_Widget *)this);
  local_38 = this;
  for (; toplevel != (Fl_Window *)0x0; toplevel = Fl_Widget::window((Fl_Widget *)toplevel)) {
    local_38 = toplevel;
  }
  if (local_38 == this) {
    if ((this->i != (Fl_X *)0x0) && (iVar1 = Fl_X::set_cursor(this->i,image,hotx,hoty), iVar1 == 0))
    {
      cursor(this,FL_CURSOR_DEFAULT);
    }
  }
  else {
    cursor(local_38,image,hotx,hoty);
  }
  return;
}

Assistant:

void Fl_Window::cursor(const Fl_RGB_Image *image, int hotx, int hoty) {
  int ret;

  // the cursor must be set for the top level window, not for subwindows
  Fl_Window *w = window(), *toplevel = this;

  while (w) {
    toplevel = w;
    w = w->window();
  }

  if (toplevel != this) {
    toplevel->cursor(image, hotx, hoty);
    return;
  }

  if (!i)
    return;

  ret = i->set_cursor(image, hotx, hoty);
  if (ret)
    return;

  cursor(FL_CURSOR_DEFAULT);
}